

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

int PrintString(int printlevel,char *outline)

{
  int iVar1;
  size_t sVar2;
  FString local_20;
  char *local_18;
  char *outline_local;
  int printlevel_local;
  
  local_18 = outline;
  outline_local._0_4_ = printlevel;
  iVar1 = FIntCVar::operator_cast_to_int(&msglevel);
  if ((printlevel < iVar1) || (*local_18 == '\0')) {
    outline_local._4_4_ = 0;
  }
  else {
    if ((int)outline_local == 5) {
      if (Logfile != (FILE *)0x0) {
        fputs(local_18,(FILE *)Logfile);
        fflush((FILE *)Logfile);
      }
    }
    else {
      I_PrintStr(local_18);
      AddToConsole((int)outline_local,local_18);
      iVar1 = (int)outline_local;
      if ((((vidactive & 1U) != 0) && (screen != (DFrameBuffer *)0x0)) &&
         (SmallFont != (FFont *)0x0)) {
        FString::FString(&local_20,local_18);
        FNotifyBuffer::AddString(&NotifyStrings,iVar1,&local_20);
        FString::~FString(&local_20);
        maybedrawnow(false,false);
      }
    }
    sVar2 = strlen(local_18);
    outline_local._4_4_ = (int)sVar2;
  }
  return outline_local._4_4_;
}

Assistant:

int PrintString (int printlevel, const char *outline)
{
	if (printlevel < msglevel || *outline == '\0')
	{
		return 0;
	}

	if (printlevel != PRINT_LOG)
	{
		I_PrintStr (outline);

		AddToConsole (printlevel, outline);
		if (vidactive && screen && SmallFont)
		{
			NotifyStrings.AddString(printlevel, outline);
			maybedrawnow (false, false);
		}
	}
	else if (Logfile != NULL)
	{
		fputs (outline, Logfile);
		fflush (Logfile);
	}
	return (int)strlen (outline);
}